

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uint uVar1;
  alpha_cluster *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint i_1;
  ulong uVar17;
  uint uVar18;
  uint8 t;
  uint uVar19;
  long lVar20;
  vector<unsigned_char> selectors;
  results results;
  params params;
  params local_5a8;
  long local_570;
  uint *local_568;
  vector<unsigned_long_long> *local_560;
  ulong local_558;
  dxt_hc *local_550;
  alpha_cluster *local_548;
  ulong local_540;
  vector<unsigned_int> *local_538;
  vector<unsigned_long_long> *local_530;
  ulong local_528;
  ulong local_520;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint alpha_values [8];
  uint encoding_weight [8];
  dxt5_endpoint_optimizer optimizer;
  
  uVar1 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&optimizer);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&refiner);
  selectors.m_p = (uchar *)0x0;
  selectors.m_size = 0;
  selectors.m_capacity = 0;
  local_560 = this->m_block_selectors;
  local_550 = this;
  do {
    uVar19 = (uint)data;
    if ((this->m_alpha_clusters).m_size <= uVar19) {
      vector<unsigned_char>::~vector(&selectors);
      dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&optimizer);
      return;
    }
    uVar12 = data & 0xffffffff;
    paVar2 = (this->m_alpha_clusters).m_p;
    if (paVar2[uVar12].pixels.m_size != 0) {
      params.m_block_index = 0;
      params.m_pPixels = paVar2[uVar12].pixels.m_p;
      params.m_num_pixels = paVar2[uVar12].pixels.m_size;
      params.m_comp_index = 0;
      params.m_quality = cCRNDXTQualityUber;
      params.m_use_both_block_types = false;
      vector<unsigned_char>::resize(&selectors,params.m_num_pixels,false);
      results.m_pSelectors = selectors.m_p;
      dxt5_endpoint_optimizer::compute(&optimizer,&params,&results);
      paVar2[uVar12].first_endpoint = (uint)results.m_first_endpoint;
      paVar2[uVar12].second_endpoint = (uint)results.m_second_endpoint;
      dxt5_block::get_block_values
                (block_values,(uint)results.m_first_endpoint,(uint)results.m_second_endpoint);
      local_570 = uVar12 * 0x90;
      local_568 = paVar2[uVar12].alpha_values;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        uVar18 = block_values[(byte)(&g_dxt5_from_linear)[lVar8]];
        paVar2[uVar12].alpha_values[lVar8] = uVar18;
        alpha_values[lVar8] = uVar18;
      }
      iVar15 = paVar2[uVar12].first_endpoint - paVar2[uVar12].second_endpoint;
      uVar9 = (uint)(iVar15 * iVar15) >> 3;
      if (0x7ff < uVar9) {
        uVar9 = 0x800;
      }
      if ((uint)(iVar15 * iVar15) < 8) {
        uVar9 = 1;
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        encoding_weight[lVar8] =
             (uint)(long)((((float)(int)lVar8 / -7.0) * 0.14999998 + 1.15) * (float)uVar9);
      }
      if (this->m_has_etc_color_blocks != false) {
        uVar9 = 1;
        if ((6 < iVar15) && (uVar9 = (iVar15 + 0xcU) / 0x12, 0xe < uVar9)) {
          uVar9 = 0xf;
        }
        uVar10 = (uint)results.m_first_endpoint + (uint)results.m_second_endpoint + 1 >> 1 & 0xff;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          uVar18 = determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar15 < 7]
                   [lVar8] * uVar9 + uVar10;
          if (0xfe < (int)uVar18) {
            uVar18 = 0xff;
          }
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          paVar2[uVar12].alpha_values[lVar8] = uVar18;
          alpha_values[lVar8] = uVar18;
        }
        paVar2[uVar12].first_endpoint = uVar10;
        paVar2[uVar12].second_endpoint = uVar9 << 4 | (uint)(iVar15 < 7) * 2 + 0xb;
      }
      uVar13 = 0;
      while (uVar13 < this->m_num_alpha_blocks) {
        local_528 = (ulong)(this->m_params).m_alpha_component_indices[uVar13];
        local_558 = uVar13 + 1;
        local_538 = paVar2[uVar12].blocks + uVar13 + 1;
        local_530 = local_560 + local_558;
        for (uVar17 = 0; uVar13 = local_558, uVar17 < local_538->m_size; uVar17 = uVar17 + 1) {
          uVar9 = local_538->m_p[uVar17];
          local_520 = (ulong)encoding_weight[(this->m_block_encodings).m_p[uVar9]];
          uVar13 = 0;
          for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
            uVar10 = 0xffffffff;
            uVar11 = 0;
            for (lVar20 = 0; lVar20 != 8; lVar20 = lVar20 + 1) {
              if (this->m_has_etc_color_blocks == false) {
                bVar14 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar20);
                if ((results.m_reordered & 1U) == 0) {
                  bVar14 = *(byte *)((long)&g_dxt5_to_linear + lVar20);
                }
              }
              else {
                bVar14 = (byte)lVar20;
              }
              uVar7 = (uint)this->m_blocks[uVar9 >> (this->m_has_subblocks & 0x1fU)][lVar8].field_0.
                            c[local_528] - alpha_values[bVar14];
              uVar16 = -uVar7;
              if (0 < (int)uVar7) {
                uVar16 = uVar7;
              }
              if (uVar16 < uVar10) {
                uVar11 = (ulong)bVar14;
                uVar10 = uVar16;
              }
            }
            uVar13 = uVar13 << 3 | uVar11;
          }
          local_530->m_p[uVar9] = uVar13 << 0x10 | local_520;
          this = local_550;
        }
      }
      local_5a8.m_alpha_comp_index = 0;
      local_5a8.m_highest_quality = true;
      local_5a8.m_perceptual = (this->m_params).m_perceptual;
      local_5a8.m_pSelectors = selectors.m_p;
      local_5a8.m_pPixels = paVar2[uVar12].pixels.m_p;
      local_5a8.m_num_pixels = paVar2[uVar12].pixels.m_size;
      local_5a8.m_dxt1_selectors = false;
      local_5a8.m_error_to_beat = results.m_error;
      local_5a8.m_block_index = uVar19;
      local_548 = paVar2;
      local_540 = data;
      if (this->m_has_etc_color_blocks == false) {
        bVar6 = dxt_endpoint_refiner::refine(&refiner,&local_5a8,&refinerResults);
        paVar2[uVar12].refined_alpha = bVar6;
        if (bVar6) {
          paVar2[uVar12].first_endpoint = (uint)refinerResults.m_low_color;
          paVar2[uVar12].second_endpoint = (uint)refinerResults.m_high_color;
          dxt5_block::get_block_values
                    (block_values,(uint)refinerResults.m_low_color,(uint)refinerResults.m_high_color
                    );
          for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
            *(uint *)((long)paVar2->refined_alpha_values + lVar8 * 4 + local_570) =
                 block_values[(byte)(&g_dxt5_from_linear)[lVar8]];
          }
          goto LAB_0016a8fb;
        }
      }
      else {
        paVar2[uVar12].refined_alpha = false;
      }
      uVar3 = *(undefined8 *)local_568;
      uVar4 = *(undefined8 *)(local_568 + 2);
      uVar5 = *(undefined8 *)(local_568 + 6);
      *(undefined8 *)(paVar2[uVar12].refined_alpha_values + 4) = *(undefined8 *)(local_568 + 4);
      *(undefined8 *)(paVar2[uVar12].refined_alpha_values + 6) = uVar5;
      *(undefined8 *)paVar2[uVar12].refined_alpha_values = uVar3;
      *(undefined8 *)(paVar2[uVar12].refined_alpha_values + 2) = uVar4;
    }
LAB_0016a8fb:
    data = (uint64)(uVar19 + uVar1 + 1);
  } while( true );
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}